

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall Glucose::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  Clause *this_00;
  vec<unsigned_int> *pvVar1;
  int *piVar2;
  byte bVar3;
  Lit p;
  vec<unsigned_int> *pvVar4;
  uint uVar5;
  int iVar6;
  CRef CVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  puVar10 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
  this_00 = (Clause *)(puVar10 + cr);
  Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
  if ((this->super_Solver).certifiedUNSAT == true) {
    if ((this->super_Solver).vbyte == false) {
      if (0 < *(int *)&(this_00->header).field_0x4) {
        lVar14 = 0;
        do {
          uVar13 = *(uint *)(&this_00[1].header.field_0x0 + lVar14 * 4);
          if (uVar13 != l.x) {
            uVar5 = ~((int)uVar13 >> 1);
            if ((uVar13 & 1) == 0) {
              uVar5 = ((int)uVar13 >> 1) + 1;
            }
            fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar5);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)&(this_00->header).field_0x4);
      }
      fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
    }
    else {
      Solver::write_char(&this->super_Solver,'a');
      if (0 < *(int *)&(this_00->header).field_0x4) {
        lVar14 = 0;
        do {
          iVar6 = *(int *)(&this_00[1].header.field_0x0 + lVar14 * 4);
          if (iVar6 != l.x) {
            Solver::write_lit(&this->super_Solver,iVar6 + 2);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)&(this_00->header).field_0x4);
      }
      Solver::write_lit(&this->super_Solver,0);
    }
  }
  if (*(int *)&(this_00->header).field_0x4 == 2) {
    removeClause(this,cr,false);
    uVar8 = *(ulong *)&this_00->header >> 0x20;
    iVar6 = (int)(*(ulong *)&this_00->header >> 0x20);
    uVar9 = 0;
    if (0 < iVar6) {
      uVar15 = 0;
      do {
        uVar9 = uVar15;
        if (*(int *)(&this_00[1].header.field_0x0 + uVar15 * 4) == l.x) break;
        uVar15 = uVar15 + 1;
        uVar9 = uVar8;
      } while (uVar8 != uVar15);
    }
    iVar6 = iVar6 + -1;
    if ((int)uVar9 < iVar6) {
      puVar10 = puVar10 + (ulong)cr + (uVar9 & 0xffffffff) + 4;
      do {
        puVar10[-1] = *puVar10;
        puVar10 = puVar10 + 1;
        uVar13 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar13;
      } while ((int)uVar13 < iVar6);
    }
    Clause::shrink(this_00,1);
    uVar9 = *(ulong *)&this_00->header >> 0x20;
    if ((int)(*(ulong *)&this_00->header >> 0x20) < 1) {
      uVar13 = 0;
    }
    else {
      uVar8 = 0;
      uVar13 = 0;
      do {
        uVar13 = uVar13 | 1 << ((byte)(&this_00[1].header.field_0x0)[uVar8 * 4] >> 1 & 0x1f);
        uVar8 = uVar8 + 1;
      } while (uVar9 != uVar8);
    }
    *(uint *)(&this_00[1].header.field_0x0 + uVar9 * 4) = uVar13;
  }
  else {
    if ((this->super_Solver).certifiedUNSAT == true) {
      if ((this->super_Solver).vbyte == true) {
        Solver::write_char(&this->super_Solver,'d');
        if (0 < *(int *)&(this_00->header).field_0x4) {
          lVar14 = 0;
          do {
            Solver::write_lit(&this->super_Solver,
                              *(int *)(&this_00[1].header.field_0x0 + lVar14 * 4) + 2);
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)&(this_00->header).field_0x4);
        }
        Solver::write_lit(&this->super_Solver,0);
      }
      else {
        fwrite("d ",2,1,(FILE *)(this->super_Solver).certifiedOutput);
        if (0 < *(int *)&(this_00->header).field_0x4) {
          lVar14 = 0;
          do {
            uVar13 = *(uint *)(&this_00[1].header.field_0x0 + lVar14 * 4);
            uVar11 = (int)uVar13 >> 1;
            uVar5 = ~uVar11;
            if ((uVar13 & 1) == 0) {
              uVar5 = uVar11 + 1;
            }
            fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar5);
            lVar14 = lVar14 + 1;
          } while (lVar14 < *(int *)&(this_00->header).field_0x4);
        }
        fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
      }
    }
    Solver::detachClause(&this->super_Solver,cr,true);
    uVar15 = *(ulong *)&this_00->header >> 0x20;
    uVar8 = 0;
    iVar6 = (int)(*(ulong *)&this_00->header >> 0x20);
    uVar9 = uVar8;
    if (0 < iVar6) {
      do {
        uVar9 = uVar8;
        if (*(int *)(&this_00[1].header.field_0x0 + uVar8 * 4) == l.x) break;
        uVar8 = uVar8 + 1;
        uVar9 = uVar15;
      } while (uVar15 != uVar8);
    }
    iVar6 = iVar6 + -1;
    if ((int)uVar9 < iVar6) {
      puVar10 = puVar10 + (ulong)cr + (uVar9 & 0xffffffff) + 4;
      do {
        puVar10[-1] = *puVar10;
        puVar10 = puVar10 + 1;
        uVar13 = (int)uVar9 + 1;
        uVar9 = (ulong)uVar13;
      } while ((int)uVar13 < iVar6);
    }
    Clause::shrink(this_00,1);
    uVar9 = *(ulong *)&this_00->header >> 0x20;
    uVar8 = 0;
    uVar13 = 0;
    if (0 < (int)(*(ulong *)&this_00->header >> 0x20)) {
      uVar15 = 0;
      uVar13 = 0;
      do {
        uVar13 = uVar13 | 1 << ((byte)(&this_00[1].header.field_0x0)[uVar15 * 4] >> 1 & 0x1f);
        uVar15 = uVar15 + 1;
      } while (uVar9 != uVar15);
    }
    *(uint *)(&this_00[1].header.field_0x0 + uVar9 * 4) = uVar13;
    Solver::attachClause(&this->super_Solver,cr);
    iVar6 = l.x >> 1;
    pvVar4 = (this->occurs).occs.data;
    pvVar1 = pvVar4 + iVar6;
    uVar13 = pvVar4[iVar6].sz;
    if (0 < (int)uVar13) {
      uVar8 = 0;
      do {
        if (pvVar1->data[uVar8] == cr) goto LAB_00115d55;
        uVar8 = uVar8 + 1;
      } while (uVar13 != uVar8);
      uVar8 = (ulong)uVar13;
    }
LAB_00115d55:
    iVar12 = uVar13 - 1;
    if ((int)uVar8 < iVar12) {
      puVar10 = pvVar1->data + (uVar8 & 0xffffffff);
      do {
        *puVar10 = puVar10[1];
        iVar12 = pvVar1->sz + -1;
        uVar13 = (int)uVar8 + 1;
        uVar8 = (ulong)uVar13;
        puVar10 = puVar10 + 1;
      } while ((int)uVar13 < iVar12);
    }
    pvVar1->sz = iVar12;
    piVar2 = (this->n_occ).data + l.x;
    *piVar2 = *piVar2 + -1;
    if (((iVar6 < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[iVar6])) ||
       (((this->frozen).data[iVar6] == '\0' &&
        (((this->eliminated).data[iVar6] == '\0' &&
         (((this->super_Solver).assigns.data[iVar6].value & 2) != 0)))))) {
      Heap<Glucose::SimpSolver::ElimLt>::update(&this->elim_heap,iVar6);
    }
  }
  bVar16 = true;
  if (((undefined1  [12])this_00->header & (undefined1  [12])0xffffffff00000000) ==
      (undefined1  [12])0x100000000) {
    p.x = *(int *)&this_00[1].header;
    bVar3 = (this->super_Solver).assigns.data[p.x >> 1].value;
    if ((bVar3 & 2) == 0) {
      if ((bVar3 ^ (byte)p.x & 1) == 1) {
        return false;
      }
    }
    else {
      Solver::uncheckedEnqueue(&this->super_Solver,p,0xffffffff);
    }
    CVar7 = Solver::propagate(&this->super_Solver);
    bVar16 = CVar7 == 0xffffffff;
  }
  return bVar16;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) write_lit(2*(var(c[i])+1) + sign(c[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
            if (vbyte) {
                write_char('d');
                for (int i = 0; i < c.size(); i++)
                    write_lit(2*(var(c[i])+1) + sign(c[i]));
                write_lit(0);
            }
            else {
                fprintf(certifiedOutput, "d ");
                for (int i = 0; i < c.size(); i++)
                    fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
                fprintf(certifiedOutput, "0\n");
            }
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}